

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

HTS_File * HTS_fopen_from_fn(char *name,char *opt)

{
  FILE *pFVar1;
  char *in_RSI;
  char *in_RDI;
  HTS_File *fp;
  size_t in_stack_ffffffffffffffe0;
  HTS_File *local_8;
  
  local_8 = (HTS_File *)HTS_calloc((size_t)in_RSI,in_stack_ffffffffffffffe0);
  local_8->type = '\0';
  pFVar1 = fopen(in_RDI,in_RSI);
  local_8->pointer = pFVar1;
  if (local_8->pointer == (void *)0x0) {
    HTS_error(0,"HTS_fopen: Cannot open %s.\n",in_RDI);
    HTS_free((void *)0x18d720);
    local_8 = (HTS_File *)0x0;
  }
  return local_8;
}

Assistant:

HTS_File *HTS_fopen_from_fn(const char *name, const char *opt)
{
   HTS_File *fp = (HTS_File *) HTS_calloc(1, sizeof(HTS_File));

   fp->type = HTS_FILE;
   fp->pointer = (void *) fopen(name, opt);

   if (fp->pointer == NULL) {
      HTS_error(0, "HTS_fopen: Cannot open %s.\n", name);
      HTS_free(fp);
      return NULL;
   }

   return fp;
}